

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O1

bool __thiscall ON_BinaryArchive::ReadColor(ON_BinaryArchive *this,ON_4fColor *color)

{
  bool bVar1;
  uint in_EAX;
  float f;
  undefined8 uStack_28;
  
  uStack_28 = (ulong)in_EAX;
  bVar1 = ReadInt32(this,1,(ON__INT32 *)((long)&uStack_28 + 4));
  if (bVar1) {
    ON_4fColor::SetRed(color,uStack_28._4_4_);
    bVar1 = ReadInt32(this,1,(ON__INT32 *)((long)&uStack_28 + 4));
  }
  if (bVar1 != false) {
    ON_4fColor::SetGreen(color,uStack_28._4_4_);
    bVar1 = ReadInt32(this,1,(ON__INT32 *)((long)&uStack_28 + 4));
  }
  if (bVar1 != false) {
    ON_4fColor::SetBlue(color,uStack_28._4_4_);
    bVar1 = ReadInt32(this,1,(ON__INT32 *)((long)&uStack_28 + 4));
  }
  if (bVar1 != false) {
    ON_4fColor::SetAlpha(color,uStack_28._4_4_);
  }
  return bVar1;
}

Assistant:

bool
ON_BinaryArchive::ReadColor(ON_4fColor& color)
{
  float f = 0.f;

  bool rc = ReadFloat(&f);
  if (rc)
  {
    color.SetRed(f);
    rc = ReadFloat(&f);
  }
  if (rc)
  {
    color.SetGreen(f);
    rc = ReadFloat(&f);
  }
  if (rc)
  {
    color.SetBlue(f);
    rc = ReadFloat(&f);
  }
  if (rc)
  {
    color.SetAlpha(f);
  }
  return rc;
}